

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

char * __thiscall tinyxml2::XMLDocument::Identify(XMLDocument *this,char *p,XMLNode **node)

{
  byte *pbVar1;
  long lVar2;
  int iVar3;
  XMLNode *pXVar4;
  long lVar5;
  undefined **ppuVar6;
  byte bVar7;
  byte bVar8;
  char *pcVar9;
  
  bVar8 = *p;
  pcVar9 = p;
  while (-1 < (char)bVar8) {
    iVar3 = isspace((uint)bVar8);
    if (iVar3 == 0) {
      if (bVar8 == 0) {
        pXVar4 = (XMLNode *)0x0;
        goto LAB_001b06c1;
      }
      break;
    }
    pbVar1 = (byte *)(pcVar9 + 1);
    pcVar9 = pcVar9 + 1;
    bVar8 = *pbVar1;
  }
  if (pcVar9 == "<?") {
LAB_001b05d4:
    pXVar4 = (XMLNode *)MemPoolT<88>::Alloc(&this->_commentPool);
    pXVar4->_document = this;
    pXVar4->_parent = (XMLNode *)0x0;
    (pXVar4->_value)._flags = 0;
    (pXVar4->_value)._start = (char *)0x0;
    (pXVar4->_value)._end = (char *)0x0;
    pXVar4->_firstChild = (XMLNode *)0x0;
    pXVar4->_lastChild = (XMLNode *)0x0;
    pXVar4->_prev = (XMLNode *)0x0;
    pXVar4->_next = (XMLNode *)0x0;
    ppuVar6 = &PTR_ToElement_0026d680;
  }
  else {
    lVar2 = 0;
    bVar7 = bVar8;
    do {
      lVar5 = lVar2;
      if ((bVar7 != "<?"[lVar5]) || (1 < (uint)lVar5)) {
        if ((uint)lVar5 == 2) goto LAB_001b05d4;
        goto LAB_001b0498;
      }
      bVar7 = pcVar9[lVar5 + 1];
      lVar2 = lVar5 + 1;
    } while (bVar7 != 0);
    if (((int)(lVar5 + 1) == 2) || ("<?"[lVar5 + 1] == '\0')) goto LAB_001b05d4;
LAB_001b0498:
    if (pcVar9 == "<!--") {
LAB_001b062c:
      pXVar4 = (XMLNode *)MemPoolT<88>::Alloc(&this->_commentPool);
      pXVar4->_document = this;
      pXVar4->_parent = (XMLNode *)0x0;
      (pXVar4->_value)._flags = 0;
      (pXVar4->_value)._start = (char *)0x0;
      (pXVar4->_value)._end = (char *)0x0;
      pXVar4->_firstChild = (XMLNode *)0x0;
      pXVar4->_lastChild = (XMLNode *)0x0;
      pXVar4->_prev = (XMLNode *)0x0;
      pXVar4->_next = (XMLNode *)0x0;
      pXVar4->_vptr_XMLNode = (_func_int **)&PTR_ToElement_0026d5e0;
      pXVar4->_memPool = &(this->_commentPool).super_MemPool;
      pcVar9 = pcVar9 + 4;
      goto LAB_001b06c1;
    }
    lVar2 = 0;
    bVar7 = bVar8;
    do {
      lVar5 = lVar2;
      if ((bVar7 != "<!--"[lVar5]) || (3 < (uint)lVar5)) {
        if ((uint)lVar5 == 4) goto LAB_001b062c;
        goto LAB_001b04dd;
      }
      bVar7 = pcVar9[lVar5 + 1];
      lVar2 = lVar5 + 1;
    } while (bVar7 != 0);
    if (((int)(lVar5 + 1) == 4) || ("<!--"[lVar5 + 1] == '\0')) goto LAB_001b062c;
LAB_001b04dd:
    if (pcVar9 == "<![CDATA[") {
LAB_001b067a:
      pXVar4 = (XMLNode *)MemPoolT<96>::Alloc(&this->_textPool);
      pXVar4->_document = this;
      pXVar4->_parent = (XMLNode *)0x0;
      (pXVar4->_value)._flags = 0;
      (pXVar4->_value)._start = (char *)0x0;
      (pXVar4->_value)._end = (char *)0x0;
      pXVar4->_firstChild = (XMLNode *)0x0;
      pXVar4->_lastChild = (XMLNode *)0x0;
      pXVar4->_prev = (XMLNode *)0x0;
      pXVar4->_next = (XMLNode *)0x0;
      pXVar4->_vptr_XMLNode = (_func_int **)&PTR_ToElement_0026d978;
      pXVar4->_memPool = &(this->_textPool).super_MemPool;
      pcVar9 = pcVar9 + 9;
      *(undefined1 *)&pXVar4[1]._vptr_XMLNode = 1;
      goto LAB_001b06c1;
    }
    lVar2 = 0;
    bVar7 = bVar8;
    do {
      lVar5 = lVar2;
      if ((bVar7 != "<![CDATA["[lVar5]) || (8 < (uint)lVar5)) {
        if ((uint)lVar5 == 9) goto LAB_001b067a;
        goto LAB_001b0522;
      }
      bVar7 = pcVar9[lVar5 + 1];
      lVar2 = lVar5 + 1;
    } while (bVar7 != 0);
    if (((int)(lVar5 + 1) == 9) || ("<![CDATA["[lVar5 + 1] == '\0')) goto LAB_001b067a;
LAB_001b0522:
    if (pcVar9 != "<!") {
      lVar2 = 0;
      bVar7 = bVar8;
      do {
        lVar5 = lVar2;
        if ((bVar7 != "<!"[lVar5]) || (1 < (uint)lVar5)) {
          if ((uint)lVar5 == 2) goto LAB_001b06d9;
          goto LAB_001b0567;
        }
        bVar7 = pcVar9[lVar5 + 1];
        lVar2 = lVar5 + 1;
      } while (bVar7 != 0);
      if (((int)(lVar5 + 1) != 2) && ("<!"[lVar5 + 1] != '\0')) {
LAB_001b0567:
        if (pcVar9 == "<" || bVar8 == 0x3c) {
          pXVar4 = (XMLNode *)MemPoolT<104>::Alloc(&this->_elementPool);
          pXVar4->_document = this;
          pXVar4->_parent = (XMLNode *)0x0;
          (pXVar4->_value)._flags = 0;
          (pXVar4->_value)._start = (char *)0x0;
          (pXVar4->_value)._end = (char *)0x0;
          pXVar4->_firstChild = (XMLNode *)0x0;
          pXVar4->_lastChild = (XMLNode *)0x0;
          pXVar4->_prev = (XMLNode *)0x0;
          pXVar4->_next = (XMLNode *)0x0;
          pXVar4->_vptr_XMLNode = (_func_int **)&PTR_ToElement_0026d7c0;
          *(undefined4 *)&pXVar4[1]._vptr_XMLNode = 0;
          pXVar4[1]._document = (XMLDocument *)0x0;
          pXVar4->_memPool = &(this->_elementPool).super_MemPool;
          pcVar9 = pcVar9 + 1;
        }
        else {
          pXVar4 = (XMLNode *)MemPoolT<96>::Alloc(&this->_textPool);
          pXVar4->_document = this;
          pXVar4->_parent = (XMLNode *)0x0;
          (pXVar4->_value)._flags = 0;
          (pXVar4->_value)._start = (char *)0x0;
          (pXVar4->_value)._end = (char *)0x0;
          pXVar4->_firstChild = (XMLNode *)0x0;
          pXVar4->_lastChild = (XMLNode *)0x0;
          pXVar4->_prev = (XMLNode *)0x0;
          pXVar4->_next = (XMLNode *)0x0;
          pXVar4->_vptr_XMLNode = (_func_int **)&PTR_ToElement_0026d978;
          *(undefined1 *)&pXVar4[1]._vptr_XMLNode = 0;
          pXVar4->_memPool = &(this->_textPool).super_MemPool;
          pcVar9 = p;
        }
        goto LAB_001b06c1;
      }
    }
LAB_001b06d9:
    pXVar4 = (XMLNode *)MemPoolT<88>::Alloc(&this->_commentPool);
    pXVar4->_document = this;
    pXVar4->_parent = (XMLNode *)0x0;
    (pXVar4->_value)._flags = 0;
    (pXVar4->_value)._start = (char *)0x0;
    (pXVar4->_value)._end = (char *)0x0;
    pXVar4->_firstChild = (XMLNode *)0x0;
    pXVar4->_lastChild = (XMLNode *)0x0;
    pXVar4->_prev = (XMLNode *)0x0;
    pXVar4->_next = (XMLNode *)0x0;
    ppuVar6 = &PTR_ToElement_0026d720;
  }
  pXVar4->_vptr_XMLNode = (_func_int **)ppuVar6;
  pXVar4->_memPool = &(this->_commentPool).super_MemPool;
  pcVar9 = pcVar9 + 2;
LAB_001b06c1:
  *node = pXVar4;
  return pcVar9;
}

Assistant:

char* XMLDocument::Identify( char* p, XMLNode** node )
{
    TIXMLASSERT( node );
    TIXMLASSERT( p );
    char* const start = p;
    p = XMLUtil::SkipWhiteSpace( p );
    if( !*p ) {
        *node = 0;
        TIXMLASSERT( p );
        return p;
    }

    // These strings define the matching patterns:
    static const char* xmlHeader		= { "<?" };
    static const char* commentHeader	= { "<!--" };
    static const char* cdataHeader		= { "<![CDATA[" };
    static const char* dtdHeader		= { "<!" };
    static const char* elementHeader	= { "<" };	// and a header for everything else; check last.

    static const int xmlHeaderLen		= 2;
    static const int commentHeaderLen	= 4;
    static const int cdataHeaderLen		= 9;
    static const int dtdHeaderLen		= 2;
    static const int elementHeaderLen	= 1;

    TIXMLASSERT( sizeof( XMLComment ) == sizeof( XMLUnknown ) );		// use same memory pool
    TIXMLASSERT( sizeof( XMLComment ) == sizeof( XMLDeclaration ) );	// use same memory pool
    XMLNode* returnNode = 0;
    if ( XMLUtil::StringEqual( p, xmlHeader, xmlHeaderLen ) ) {
        TIXMLASSERT( sizeof( XMLDeclaration ) == _commentPool.ItemSize() );
        returnNode = new (_commentPool.Alloc()) XMLDeclaration( this );
        returnNode->_memPool = &_commentPool;
        p += xmlHeaderLen;
    }
    else if ( XMLUtil::StringEqual( p, commentHeader, commentHeaderLen ) ) {
        TIXMLASSERT( sizeof( XMLComment ) == _commentPool.ItemSize() );
        returnNode = new (_commentPool.Alloc()) XMLComment( this );
        returnNode->_memPool = &_commentPool;
        p += commentHeaderLen;
    }
    else if ( XMLUtil::StringEqual( p, cdataHeader, cdataHeaderLen ) ) {
        TIXMLASSERT( sizeof( XMLText ) == _textPool.ItemSize() );
        XMLText* text = new (_textPool.Alloc()) XMLText( this );
        returnNode = text;
        returnNode->_memPool = &_textPool;
        p += cdataHeaderLen;
        text->SetCData( true );
    }
    else if ( XMLUtil::StringEqual( p, dtdHeader, dtdHeaderLen ) ) {
        TIXMLASSERT( sizeof( XMLUnknown ) == _commentPool.ItemSize() );
        returnNode = new (_commentPool.Alloc()) XMLUnknown( this );
        returnNode->_memPool = &_commentPool;
        p += dtdHeaderLen;
    }
    else if ( XMLUtil::StringEqual( p, elementHeader, elementHeaderLen ) ) {
        TIXMLASSERT( sizeof( XMLElement ) == _elementPool.ItemSize() );
        returnNode = new (_elementPool.Alloc()) XMLElement( this );
        returnNode->_memPool = &_elementPool;
        p += elementHeaderLen;
    }
    else {
        TIXMLASSERT( sizeof( XMLText ) == _textPool.ItemSize() );
        returnNode = new (_textPool.Alloc()) XMLText( this );
        returnNode->_memPool = &_textPool;
        p = start;	// Back it up, all the text counts.
    }

    TIXMLASSERT( returnNode );
    TIXMLASSERT( p );
    *node = returnNode;
    return p;
}